

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void * __thiscall ON_XMLVariant::AsBuffer(ON_XMLVariant *this,size_t *size_out)

{
  ON__UINT64 OVar1;
  ON__UINT8 *pOVar2;
  undefined1 local_58 [8];
  ON_Buffer buf;
  size_t *size_out_local;
  ON_XMLVariant *this_local;
  
  buf.m_reserved._4_8_ = size_out;
  (*this->_vptr_ON_XMLVariant[0x2b])();
  OVar1 = ON_Buffer::Size((ON_Buffer *)local_58);
  *(ON__UINT64 *)buf.m_reserved._4_8_ = OVar1;
  if ((this->_private->_raw_buffer != (ON__UINT8 *)0x0) &&
     (pOVar2 = this->_private->_raw_buffer, pOVar2 != (ON__UINT8 *)0x0)) {
    operator_delete__(pOVar2);
  }
  pOVar2 = (ON__UINT8 *)operator_new__(*(ulong *)buf.m_reserved._4_8_);
  this->_private->_raw_buffer = pOVar2;
  ON_Buffer::Read((ON_Buffer *)local_58,*(ON__UINT64 *)buf.m_reserved._4_8_,
                  this->_private->_raw_buffer);
  pOVar2 = this->_private->_raw_buffer;
  ON_Buffer::~ON_Buffer((ON_Buffer *)local_58);
  return pOVar2;
}

Assistant:

void* ON_XMLVariant::AsBuffer(size_t& size_out) const
{
  auto buf = AsBuffer();
  size_out = size_t(buf.Size());

  if (nullptr != _private->_raw_buffer)
    delete[] _private->_raw_buffer;

  _private->_raw_buffer = new ON__UINT8[size_out];
  buf.Read(size_out, _private->_raw_buffer);

  return _private->_raw_buffer;
}